

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiTextBuffer::append(ImGuiTextBuffer *this,char *str,char *str_end)

{
  int *piVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  
  if (str_end == (char *)0x0) {
    sVar4 = strlen(str);
    uVar9 = (uint)sVar4;
  }
  else {
    uVar9 = (int)str_end - (int)str;
  }
  iVar8 = (this->Buf).Size;
  iVar2 = (this->Buf).Capacity;
  iVar8 = iVar8 + (uint)(iVar8 == 0);
  iVar6 = uVar9 + iVar8;
  if (iVar2 <= iVar6) {
    iVar7 = iVar2 * 2;
    if (iVar6 != iVar7 && SBORROW4(iVar6,iVar7) == iVar6 + iVar2 * -2 < 0) {
      iVar7 = iVar6;
    }
    if (iVar2 < iVar7) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      pcVar5 = (char *)(*GImAllocatorAllocFunc)((long)iVar7,GImAllocatorUserData);
      pcVar3 = (this->Buf).Data;
      if (pcVar3 != (char *)0x0) {
        memcpy(pcVar5,pcVar3,(long)(this->Buf).Size);
        pcVar3 = (this->Buf).Data;
        if ((pcVar3 != (char *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pcVar3,GImAllocatorUserData);
      }
      (this->Buf).Data = pcVar5;
      (this->Buf).Capacity = iVar7;
    }
  }
  iVar2 = (this->Buf).Capacity;
  if (iVar2 < iVar6) {
    if (iVar2 == 0) {
      iVar7 = 8;
    }
    else {
      iVar7 = iVar2 / 2 + iVar2;
    }
    if (iVar7 <= iVar6) {
      iVar7 = iVar6;
    }
    if (iVar2 < iVar7) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      pcVar5 = (char *)(*GImAllocatorAllocFunc)((long)iVar7,GImAllocatorUserData);
      pcVar3 = (this->Buf).Data;
      if (pcVar3 != (char *)0x0) {
        memcpy(pcVar5,pcVar3,(long)(this->Buf).Size);
        pcVar3 = (this->Buf).Data;
        if ((pcVar3 != (char *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pcVar3,GImAllocatorUserData);
      }
      (this->Buf).Data = pcVar5;
      (this->Buf).Capacity = iVar7;
    }
  }
  (this->Buf).Size = iVar6;
  if ((-1 < (int)uVar9) && (0 < iVar8)) {
    memcpy((this->Buf).Data + (iVar8 - 1U),str,(ulong)(uVar9 & 0x7fffffff));
    uVar9 = (iVar8 - 1U) + uVar9;
    if ((-1 < (int)uVar9) && ((int)uVar9 < (this->Buf).Size)) {
      (this->Buf).Data[uVar9] = '\0';
      return;
    }
  }
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.h"
                ,0x68b,"T &ImVector<char>::operator[](int) [T = char]");
}

Assistant:

void ImGuiTextBuffer::append(const char* str, const char* str_end)
{
    int len = str_end ? (int)(str_end - str) : (int)strlen(str);

    // Add zero-terminator the first time
    const int write_off = (Buf.Size != 0) ? Buf.Size : 1;
    const int needed_sz = write_off + len;
    if (write_off + len >= Buf.Capacity)
    {
        int new_capacity = Buf.Capacity * 2;
        Buf.reserve(needed_sz > new_capacity ? needed_sz : new_capacity);
    }

    Buf.resize(needed_sz);
    memcpy(&Buf[write_off - 1], str, (size_t)len);
    Buf[write_off - 1 + len] = 0;
}